

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u32 iVal;
  long in_FS_OFFSET;
  uchar *z;
  uchar *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = sqlite3_value_text(*argv);
  if ((local_18 == (uchar *)0x0) || (*local_18 == '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  else {
    iVal = sqlite3Utf8Read(&local_18);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      sqlite3_result_int(context,iVal);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}